

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

xmlChar * xmlBuildRelativeURI(xmlChar *URI,xmlChar *base)

{
  xmlChar xVar1;
  long lVar2;
  int iVar3;
  xmlURIPtr uri;
  xmlChar *pxVar4;
  xmlURIPtr uri_00;
  xmlChar *str;
  ulong uVar5;
  ulong uVar6;
  xmlChar *pxVar7;
  char *pcVar8;
  int iVar9;
  uint local_40;
  
  if (((URI == (xmlChar *)0x0) || (*URI == '\0')) || (uri = xmlCreateURI(), uri == (xmlURIPtr)0x0))
  {
    return (xmlChar *)0x0;
  }
  if (*URI != '.') {
    iVar3 = xmlParse3986URIReference(uri,(char *)URI);
    if (iVar3 == 0) goto LAB_00187ce7;
LAB_00187d25:
    uri_00 = (xmlURIPtr)0x0;
LAB_00187d28:
    pxVar4 = (xmlChar *)0x0;
    goto LAB_00187d2b;
  }
  pxVar4 = xmlStrdup(URI);
  uri->path = (char *)pxVar4;
LAB_00187ce7:
  if ((base == (xmlChar *)0x0) || (*base == '\0')) {
    pxVar4 = xmlStrdup(URI);
    uri_00 = (xmlURIPtr)0x0;
    goto LAB_00187d2b;
  }
  uri_00 = xmlCreateURI();
  if (uri_00 == (xmlURIPtr)0x0) goto LAB_00187d25;
  if (*base == '.') {
    pxVar4 = xmlStrdup(base);
    uri_00->path = (char *)pxVar4;
  }
  else {
    iVar3 = xmlParse3986URIReference(uri_00,(char *)base);
    if (iVar3 != 0) goto LAB_00187d28;
  }
  if (((xmlChar *)uri->scheme == (xmlChar *)0x0) ||
     ((((xmlChar *)uri_00->scheme != (xmlChar *)0x0 &&
       (iVar3 = xmlStrcmp((xmlChar *)uri_00->scheme,(xmlChar *)uri->scheme), iVar3 == 0)) &&
      (iVar3 = xmlStrcmp((xmlChar *)uri_00->server,(xmlChar *)uri->server), iVar3 == 0)))) {
    iVar3 = xmlStrEqual((xmlChar *)uri_00->path,(xmlChar *)uri->path);
    if (iVar3 == 0) {
      pcVar8 = uri_00->path;
      URI = (xmlChar *)uri->path;
      if (pcVar8 != (char *)0x0) {
        pxVar4 = URI;
        if (URI == (xmlChar *)0x0) {
          pxVar4 = "/";
          uri->path = "/";
          pcVar8 = uri_00->path;
        }
        if (*pxVar4 == '.') {
          pxVar4 = pxVar4 + (ulong)(pxVar4[1] == '/') * 2;
        }
        if (*pcVar8 == '/') {
          pcVar8 = pcVar8 + (*pxVar4 != '/');
        }
        else if (*pcVar8 == '.') {
          pcVar8 = pcVar8 + (ulong)(pcVar8[1] == '/') * 2;
        }
        uVar5 = 0;
        do {
          xVar1 = pcVar8[uVar5];
          pxVar7 = pxVar4 + uVar5;
          uVar5 = uVar5 + 1;
          if (xVar1 == '\0') break;
        } while (xVar1 == *pxVar7);
        if (xVar1 != *pxVar7) {
          iVar3 = 0;
          do {
            uVar6 = uVar5 - 1;
            if ((long)uVar6 < 1) goto LAB_00187e54;
            lVar2 = uVar5 - 2;
            uVar5 = uVar6;
          } while (pxVar4[lVar2] != '/');
          iVar3 = (int)uVar6;
LAB_00187e54:
          uVar5 = 0;
          if ((long)uVar6 < 1) {
            uVar6 = uVar5;
          }
          pcVar8 = pcVar8 + (int)uVar6;
          do {
            iVar9 = (int)uVar5;
            if (*pcVar8 == '/') {
              uVar5 = (ulong)(iVar9 + 1);
            }
            else if (*pcVar8 == '\0') goto LAB_00187e7d;
            pcVar8 = pcVar8 + 1;
          } while( true );
        }
        pcVar8 = "";
        goto LAB_00187e31;
      }
    }
    else {
      URI = "";
    }
  }
  pxVar4 = xmlStrdup(URI);
LAB_00187d2b:
  xmlFreeURI(uri);
  if (uri_00 != (xmlURIPtr)0x0) {
    xmlFreeURI(uri_00);
  }
  return pxVar4;
LAB_00187e7d:
  pxVar4 = pxVar4 + iVar3;
  if ((iVar9 == 0) && (*pxVar4 == '\0')) {
    pcVar8 = "./";
LAB_00187e31:
    pxVar4 = xmlStrdup((xmlChar *)pcVar8);
  }
  else {
    local_40 = xmlStrlen(pxVar4);
    if (iVar9 == 0) {
      pxVar4 = xmlURIEscapeStr(pxVar4,(xmlChar *)"/;&=+$,");
    }
    else {
      str = (xmlChar *)(*xmlMalloc)((long)(int)(iVar9 * 3 + local_40 + 1));
      pxVar7 = str;
      if (str == (xmlChar *)0x0) {
        xmlURIErrMemory("building relative URI\n");
        pxVar4 = (xmlChar *)0x0;
      }
      else {
        for (; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
          pxVar7[0] = '.';
          pxVar7[1] = '.';
          pxVar7[2] = '/';
          pxVar7 = pxVar7 + 3;
        }
        if ((((str < pxVar7) && (-1 < (int)local_40)) && (*pxVar4 == '/')) && (pxVar7[-1] == '/')) {
          memcpy(pxVar7,pxVar4 + 1,(ulong)local_40);
          local_40 = local_40 - 1;
        }
        else {
          memcpy(pxVar7,pxVar4,(long)(int)(local_40 + 1));
        }
        pxVar7[(int)local_40] = '\0';
        pxVar4 = xmlURIEscapeStr(str,(xmlChar *)"/;&=+$,");
        (*xmlFree)(str);
      }
    }
  }
  if (URI == (xmlChar *)0x0) {
    uri->path = (char *)0x0;
  }
  goto LAB_00187d2b;
}

Assistant:

xmlChar *
xmlBuildRelativeURI (const xmlChar * URI, const xmlChar * base)
{
    xmlChar *val = NULL;
    int ret;
    int ix;
    int nbslash = 0;
    int len;
    xmlURIPtr ref = NULL;
    xmlURIPtr bas = NULL;
    xmlChar *bptr, *uptr, *vptr;
    int remove_path = 0;

    if ((URI == NULL) || (*URI == 0))
	return NULL;

    /*
     * First parse URI into a standard form
     */
    ref = xmlCreateURI ();
    if (ref == NULL)
	return NULL;
    /* If URI not already in "relative" form */
    if (URI[0] != '.') {
	ret = xmlParseURIReference (ref, (const char *) URI);
	if (ret != 0)
	    goto done;		/* Error in URI, return NULL */
    } else
	ref->path = (char *)xmlStrdup(URI);

    /*
     * Next parse base into the same standard form
     */
    if ((base == NULL) || (*base == 0)) {
	val = xmlStrdup (URI);
	goto done;
    }
    bas = xmlCreateURI ();
    if (bas == NULL)
	goto done;
    if (base[0] != '.') {
	ret = xmlParseURIReference (bas, (const char *) base);
	if (ret != 0)
	    goto done;		/* Error in base, return NULL */
    } else
	bas->path = (char *)xmlStrdup(base);

    /*
     * If the scheme / server on the URI differs from the base,
     * just return the URI
     */
    if ((ref->scheme != NULL) &&
	((bas->scheme == NULL) ||
	 (xmlStrcmp ((xmlChar *)bas->scheme, (xmlChar *)ref->scheme)) ||
	 (xmlStrcmp ((xmlChar *)bas->server, (xmlChar *)ref->server)))) {
	val = xmlStrdup (URI);
	goto done;
    }
    if (xmlStrEqual((xmlChar *)bas->path, (xmlChar *)ref->path)) {
	val = xmlStrdup(BAD_CAST "");
	goto done;
    }
    if (bas->path == NULL) {
	val = xmlStrdup((xmlChar *)ref->path);
	goto done;
    }
    if (ref->path == NULL) {
        ref->path = (char *) "/";
	remove_path = 1;
    }

    /*
     * At this point (at last!) we can compare the two paths
     *
     * First we take care of the special case where either of the
     * two path components may be missing (bug 316224)
     */
    bptr = (xmlChar *)bas->path;
    {
        xmlChar *rptr = (xmlChar *) ref->path;
        int pos = 0;

        /*
         * Next we compare the two strings and find where they first differ
         */
	if ((*rptr == '.') && (rptr[1] == '/'))
            rptr += 2;
	if ((*bptr == '.') && (bptr[1] == '/'))
            bptr += 2;
	else if ((*bptr == '/') && (*rptr != '/'))
	    bptr++;
	while ((bptr[pos] == rptr[pos]) && (bptr[pos] != 0))
	    pos++;

	if (bptr[pos] == rptr[pos]) {
	    val = xmlStrdup(BAD_CAST "");
	    goto done;		/* (I can't imagine why anyone would do this) */
	}

	/*
	 * In URI, "back up" to the last '/' encountered.  This will be the
	 * beginning of the "unique" suffix of URI
	 */
	ix = pos;
	for (; ix > 0; ix--) {
	    if (rptr[ix - 1] == '/')
		break;
	}
	uptr = (xmlChar *)&rptr[ix];

	/*
	 * In base, count the number of '/' from the differing point
	 */
	for (; bptr[ix] != 0; ix++) {
	    if (bptr[ix] == '/')
		nbslash++;
	}

	/*
	 * e.g: URI="foo/" base="foo/bar" -> "./"
	 */
	if (nbslash == 0 && !uptr[0]) {
	    val = xmlStrdup(BAD_CAST "./");
	    goto done;
	}

	len = xmlStrlen (uptr) + 1;
    }

    if (nbslash == 0) {
	if (uptr != NULL)
	    /* exception characters from xmlSaveUri */
	    val = xmlURIEscapeStr(uptr, BAD_CAST "/;&=+$,");
	goto done;
    }

    /*
     * Allocate just enough space for the returned string -
     * length of the remainder of the URI, plus enough space
     * for the "../" groups, plus one for the terminator
     */
    val = (xmlChar *) xmlMalloc (len + 3 * nbslash);
    if (val == NULL) {
        xmlURIErrMemory("building relative URI\n");
	goto done;
    }
    vptr = val;
    /*
     * Put in as many "../" as needed
     */
    for (; nbslash>0; nbslash--) {
	*vptr++ = '.';
	*vptr++ = '.';
	*vptr++ = '/';
    }
    /*
     * Finish up with the end of the URI
     */
    if (uptr != NULL) {
        if ((vptr > val) && (len > 0) &&
	    (uptr[0] == '/') && (vptr[-1] == '/')) {
	    memcpy (vptr, uptr + 1, len - 1);
	    vptr[len - 2] = 0;
	} else {
	    memcpy (vptr, uptr, len);
	    vptr[len - 1] = 0;
	}
    } else {
	vptr[len - 1] = 0;
    }

    /* escape the freshly-built path */
    vptr = val;
	/* exception characters from xmlSaveUri */
    val = xmlURIEscapeStr(vptr, BAD_CAST "/;&=+$,");
    xmlFree(vptr);

done:
    /*
     * Free the working variables
     */
    if (remove_path != 0)
        ref->path = NULL;
    if (ref != NULL)
	xmlFreeURI (ref);
    if (bas != NULL)
	xmlFreeURI (bas);

    return val;
}